

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O3

void Gia_ManAigPrintPiLevels(Gia_Man_t *p)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  size_t __size;
  uint uVar8;
  long lVar9;
  
  pVVar4 = p->vCis;
  uVar6 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar9 = 0;
    do {
      if ((int)uVar6 <= lVar9) {
LAB_007b5259:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = pVVar4->pArray[lVar9];
      if (((int)uVar2 < 0) || (p->nObjs <= (int)uVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pVVar4 = p->vLevels;
      uVar3 = pVVar4->nSize;
      if ((int)uVar2 < (int)uVar3) {
        if (uVar3 <= uVar2) goto LAB_007b5259;
      }
      else {
        lVar1 = (ulong)uVar2 + 1;
        uVar8 = pVVar4->nCap * 2;
        uVar7 = (uint)lVar1;
        if ((int)uVar2 < (int)uVar8) {
          if (pVVar4->nCap <= (int)uVar2) {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc((ulong)uVar8 << 2);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar8 << 2);
            }
            pVVar4->pArray = piVar5;
            goto LAB_007b51b2;
          }
        }
        else {
          __size = lVar1 * 4;
          if (pVVar4->pArray == (int *)0x0) {
            piVar5 = (int *)malloc(__size);
          }
          else {
            piVar5 = (int *)realloc(pVVar4->pArray,__size);
          }
          pVVar4->pArray = piVar5;
          uVar8 = uVar7;
LAB_007b51b2:
          if (piVar5 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar4->nCap = uVar8;
          uVar3 = pVVar4->nSize;
        }
        if ((int)uVar3 <= (int)uVar2) {
          memset(pVVar4->pArray + (int)uVar3,0,(ulong)(uVar2 - uVar3) * 4 + 4);
        }
        pVVar4->nSize = uVar7;
      }
      printf("%d ",(ulong)(uint)pVVar4->pArray[uVar2]);
      lVar9 = lVar9 + 1;
      pVVar4 = p->vCis;
      uVar6 = (ulong)pVVar4->nSize;
    } while (lVar9 < (long)(uVar6 - (long)p->nRegs));
  }
  putchar(10);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Synthesis script.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManAigPrintPiLevels( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachPi( p, pObj, i )
        printf( "%d ", Gia_ObjLevel(p, pObj) );
    printf( "\n" );
}